

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O2

int Cbs0_ManSolve_rec(Cbs0_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  Gia_Obj_t *pGVar11;
  int i_1;
  long lVar12;
  int i;
  long lVar13;
  Gia_Obj_t *pObjMax;
  bool bVar14;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Cbs0_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x24f,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
  }
  iVar5 = Cbs0_ManPropagate(p);
  iVar10 = 1;
  if (iVar5 == 0) {
    iVar5 = (p->pProp).iHead;
    if (iVar5 != (p->pProp).iTail) {
      __assert_fail("Cbs0_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                    ,0x253,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
    }
    iVar2 = (p->pJust).iHead;
    iVar3 = (p->pJust).iTail;
    iVar6 = iVar3 - iVar2;
    iVar10 = 0;
    if (iVar6 != 0) {
      iVar10 = (p->Pars).nJustThis;
      if (iVar6 < iVar10) {
        iVar6 = iVar10;
      }
      (p->Pars).nJustThis = iVar6;
      iVar6 = Cbs0_ManCheckLimits(p);
      iVar10 = 0;
      if (iVar6 == 0) {
        lVar12 = (long)iVar3;
        for (lVar13 = (long)iVar2; lVar13 < lVar12; lVar13 = lVar13 + 1) {
          Cbs0_QuePush(&p->pJust,(p->pJust).pData[lVar13]);
        }
        (p->pJust).iHead = iVar3;
        if ((p->Pars).fUseHighest == 0) {
          if ((p->Pars).fUseLowest == 0) {
            if ((p->Pars).fUseMaxFF == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                            ,0x264,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
            }
            if (p->pAig->pRefs == (int *)0x0) {
              __assert_fail("p->pAig->pRefs != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                            ,0x18b,"Gia_Obj_t *Cbs0_ManDecideMaxFF(Cbs0_Man_t *)");
            }
            pGVar11 = (Gia_Obj_t *)0x0;
            iVar10 = 0;
            for (; (lVar12 < (p->pJust).iTail &&
                   (pGVar4 = (p->pJust).pData[lVar12], pGVar4 != (Gia_Obj_t *)0x0));
                lVar12 = lVar12 + 1) {
              if (((ulong)pGVar4 & 1) != 0) {
                __assert_fail("!Gia_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                              ,0x14b,"int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *, Gia_Obj_t *)");
              }
              if (((int)(uint)*(undefined8 *)pGVar4 < 0) ||
                 (uVar7 = (uint)*(undefined8 *)pGVar4 & 0x1fffffff, uVar7 == 0x1fffffff)) {
                __assert_fail("Gia_ObjIsAnd(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                              ,0x14c,"int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *, Gia_Obj_t *)");
              }
              iVar8 = Gia_ObjRefNum(p->pAig,pGVar4 + -(ulong)uVar7);
              iVar6 = Gia_ObjRefNum(p->pAig,pGVar4 + -(ulong)(*(uint *)&pGVar4->field_0x4 &
                                                             0x1fffffff));
              if (iVar6 < iVar8) {
                iVar6 = iVar8;
              }
              if (iVar6 < 1) {
                __assert_fail("iCurFF > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                              ,399,"Gia_Obj_t *Cbs0_ManDecideMaxFF(Cbs0_Man_t *)");
              }
              iVar8 = iVar10;
              if (iVar10 <= iVar6) {
                iVar8 = iVar6;
              }
              if (iVar10 < iVar6) {
                pGVar11 = pGVar4;
              }
              iVar10 = iVar8;
            }
          }
          else {
            pGVar11 = (Gia_Obj_t *)0x0;
            for (; (lVar12 < (p->pJust).iTail &&
                   (pGVar4 = (p->pJust).pData[lVar12], pGVar4 != (Gia_Obj_t *)0x0));
                lVar12 = lVar12 + 1) {
              pGVar9 = pGVar11;
              if (pGVar4 < pGVar11) {
                pGVar9 = pGVar4;
              }
              bVar14 = pGVar11 == (Gia_Obj_t *)0x0;
              pGVar11 = pGVar9;
              if (bVar14) {
                pGVar11 = pGVar4;
              }
            }
          }
        }
        else {
          pGVar11 = (Gia_Obj_t *)0x0;
          for (; (lVar12 < (p->pJust).iTail &&
                 (pGVar4 = (p->pJust).pData[lVar12], pGVar4 != (Gia_Obj_t *)0x0));
              lVar12 = lVar12 + 1) {
            if (pGVar11 < pGVar4) {
              pGVar11 = pGVar4;
            }
          }
        }
        iVar10 = 0;
        iVar6 = Cbs0_VarIsJust(pGVar11);
        if (iVar6 == 0) {
          __assert_fail("Cbs0_VarIsJust( pVar )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                        ,0x265,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
        }
        iVar6 = Gia_ObjRefNum(p->pAig,pGVar11 + -(*(ulong *)pGVar11 & 0x1fffffff));
        iVar8 = Gia_ObjRefNum(p->pAig,pGVar11 + -((ulong)*(uint *)&pGVar11->field_0x4 & 0x1fffffff))
        ;
        if (iVar8 < iVar6) {
          pGVar11 = (Gia_Obj_t *)
                    ((ulong)((uint)*(undefined8 *)pGVar11 >> 0x1d & 1) ^
                    (ulong)(pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff)));
        }
        else {
          pGVar11 = Gia_ObjChild1(pGVar11);
        }
        Cbs0_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar11 ^ 1));
        iVar6 = Cbs0_ManSolve_rec(p);
        if (iVar6 != 0) {
          Cbs0_ManCancelUntil(p,iVar5);
          (p->pJust).iHead = iVar2;
          (p->pJust).iTail = iVar3;
          Cbs0_ManAssign(p,pGVar11);
          iVar5 = Cbs0_ManSolve_rec(p);
          if (iVar5 != 0) {
            piVar1 = &(p->Pars).nBTThis;
            *piVar1 = *piVar1 + 1;
            iVar10 = 1;
          }
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int Cbs0_ManSolve_rec( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_ManPropagate( p ) )
        return 1;
    // check for satisfying assignment
    assert( Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs0_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs0_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs0_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs0_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs0_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs0_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
    // decide on first fanin
    Cbs0_ManAssign( p, pDecVar );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    Cbs0_ManCancelUntil( p, iPropHead );
    Cbs0_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs0_ManAssign( p, Gia_Not(pDecVar) );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    p->Pars.nBTThis++;
    return 1;
}